

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_psrlw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  
  if (0xf < s->_q_ZMMReg[0]) {
    d->_q_ZMMReg[0] = 0;
    d->_q_ZMMReg[1] = 0;
    return;
  }
  auVar5 = *(undefined1 (*) [16])d;
  auVar1._10_2_ = 0;
  auVar1._0_10_ = auVar5._0_10_;
  auVar1._12_2_ = auVar5._6_2_;
  auVar2._8_2_ = auVar5._4_2_;
  auVar2._0_8_ = auVar5._0_8_;
  auVar2._10_4_ = auVar1._10_4_;
  auVar3._6_8_ = 0;
  auVar3._0_6_ = auVar2._8_6_;
  uVar6 = s->_q_ZMMReg[0] & 0xffffffff;
  auVar7._0_4_ = (int)(short)(auVar5._8_2_ >> uVar6);
  auVar7._4_4_ = (int)(short)(auVar5._10_2_ >> uVar6);
  auVar7._8_4_ = (int)(short)(auVar5._12_2_ >> uVar6);
  auVar7._12_4_ = (int)(short)(auVar5._14_2_ >> uVar6);
  auVar4._0_4_ = (int)(short)(auVar5._0_2_ >> uVar6);
  auVar4._4_4_ = (int)(short)((uint)CONCAT82(SUB148(auVar3 << 0x40,6),auVar5._2_2_) >> uVar6);
  auVar4._8_4_ = (int)(short)(auVar2._8_4_ >> uVar6);
  auVar4._12_4_ = (int)(short)((auVar1._10_4_ >> 0x10) >> uVar6);
  auVar5 = packssdw(auVar4,auVar7);
  *(undefined1 (*) [16])d = auVar5;
  return;
}

Assistant:

void glue(helper_psrlw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->W(0) >>= shift;
        d->W(1) >>= shift;
        d->W(2) >>= shift;
        d->W(3) >>= shift;
#if SHIFT == 1
        d->W(4) >>= shift;
        d->W(5) >>= shift;
        d->W(6) >>= shift;
        d->W(7) >>= shift;
#endif
    }
}